

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fat.cpp
# Opt level: O2

void __thiscall fat::delete_directory(fat *this,string *dir_path)

{
  pointer *this_00;
  char cVar1;
  ushort uVar2;
  boot_record *pbVar3;
  int32_t *piVar4;
  FILE *pFVar5;
  size_t sVar6;
  long lVar7;
  uint dir_cluster;
  int32_t dir_cluster_00;
  reference pvVar8;
  ostream *poVar9;
  ulong uVar10;
  void *pvVar11;
  int i_1;
  int iVar12;
  short sVar13;
  short sVar14;
  int j;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 *puStack_d0;
  int32_t aiStack_c8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  vector<fat::directory,_std::allocator<fat::directory>_> dir_children;
  vector<fat::directory,_std::allocator<fat::directory>_> parent_children;
  
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0x2f;
  puStack_d0 = (undefined1 *)0x105fce;
  explode((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_90,(fat *)dir_path,dir_path,
          (char *)&result.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((undefined1  [8])
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start == local_90) {
    puStack_d0 = (undefined1 *)0x1062ab;
    poVar9 = std::operator<<((ostream *)&std::cout,"CANNOT DELETE ROOT");
    puStack_d0 = (undefined1 *)0x1062b3;
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  else {
    puStack_d0 = (undefined1 *)0x105fee;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90);
    puStack_d0 = (undefined1 *)0x105ffd;
    dir_cluster = get_parent_cluster(this,&local_c0);
    puStack_d0 = (undefined1 *)0x10600c;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    puStack_d0 = (undefined1 *)0x10601b;
    get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)
                     &result.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,this,dir_cluster);
    if (dir_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pointer)CONCAT71(result.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                          result.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)) {
      if (-1 < (int)dir_cluster) {
        result.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             result.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + -1;
        puStack_d0 = (undefined1 *)0x10604a;
        std::__cxx11::string::~string
                  ((string *)
                   result.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        puStack_d0 = (undefined1 *)0x106059;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_a8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90);
        puStack_d0 = (undefined1 *)0x106068;
        dir_cluster_00 = get_parent_cluster(this,&local_a8);
        puStack_d0 = (undefined1 *)0x10607b;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8);
        puStack_d0 = (undefined1 *)0x10608a;
        get_dir_children((vector<fat::directory,_std::allocator<fat::directory>_> *)
                         &dir_children.
                          super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,this,dir_cluster_00);
        pbVar3 = this->fs_br;
        puStack_d0 = (undefined1 *)0x1060c9;
        fseek((FILE *)this->fs,
              (long)dir_cluster_00 * (long)pbVar3->cluster_size +
              (long)pbVar3->usable_cluster_count * (long)pbVar3->fat_copies * 4 + 0x110,0);
        puStack_d0 = (undefined1 *)0x18;
        this_00 = &dir_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        sVar13 = 0;
        for (uVar16 = 0;
            uVar16 < (ulong)(((long)parent_children.
                                    super__Vector_base<fat::directory,_std::allocator<fat::directory>_>
                                    ._M_impl.super__Vector_impl_data._M_start -
                             (long)dir_children.
                                   super__Vector_base<fat::directory,_std::allocator<fat::directory>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage) / 0x18);
            uVar16 = uVar16 + 1) {
          puStack_d0 = (undefined1 *)0x1060f1;
          pvVar8 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at
                             ((vector<fat::directory,_std::allocator<fat::directory>_> *)this_00,
                              uVar16);
          if (pvVar8->start_cluster != dir_cluster) {
            puStack_d0 = (undefined1 *)0x106104;
            pvVar8 = std::vector<fat::directory,_std::allocator<fat::directory>_>::at
                               ((vector<fat::directory,_std::allocator<fat::directory>_> *)this_00,
                                uVar16);
            puStack_d0 = (undefined1 *)0x106116;
            fwrite(pvVar8,0x18,1,(FILE *)this->fs);
            sVar13 = sVar13 + 0x18;
          }
        }
        for (sVar14 = 0; (int)sVar14 < (int)this->fs_br->cluster_size - (int)sVar13;
            sVar14 = sVar14 + 1) {
          puStack_d0 = (undefined1 *)0x106147;
          fputc(0,(FILE *)this->fs);
        }
        uVar17 = (ulong)(uint)this->fs_br->usable_cluster_count;
        lVar7 = -(uVar17 * 4 + 0xf & 0xfffffffffffffff0);
        pvVar11 = (void *)((long)aiStack_c8 + lVar7);
        piVar4 = this->fat_table;
        uVar15 = this->fs_br->usable_cluster_count;
        uVar10 = 0;
        uVar16 = (ulong)uVar15;
        if ((int)uVar15 < 1) {
          uVar16 = uVar10;
        }
        for (; uVar16 != uVar10; uVar10 = uVar10 + 1) {
          *(int32_t *)((long)pvVar11 + uVar10 * 4) = piVar4[uVar10];
        }
        *(int32_t *)((long)pvVar11 + (ulong)dir_cluster * 4) = this->FAT_UNUSED;
        pFVar5 = (FILE *)this->fs;
        iVar12 = 0;
        *(undefined8 *)((long)aiStack_c8 + lVar7 + -8) = 0x1061b1;
        fseek(pFVar5,0x110,0);
        while( true ) {
          pbVar3 = this->fs_br;
          cVar1 = pbVar3->fat_copies;
          if (cVar1 <= iVar12) break;
          pFVar5 = (FILE *)this->fs;
          *(undefined8 *)((long)aiStack_c8 + lVar7 + -8) = 1;
          sVar6 = *(size_t *)((long)aiStack_c8 + lVar7 + -8);
          *(undefined8 *)((long)aiStack_c8 + lVar7 + -8) = 0x1061d8;
          fwrite(pvVar11,uVar17 << 2,sVar6,pFVar5);
          iVar12 = iVar12 + 1;
        }
        uVar2 = pbVar3->cluster_size;
        uVar15 = (uint)uVar2;
        pvVar11 = (void *)((long)pvVar11 - (ulong)(uVar15 + 0xf & 0xfffffff0));
        *(undefined8 *)((long)pvVar11 + -8) = 0x10620e;
        memset(pvVar11,0,(ulong)uVar15);
        pFVar5 = (FILE *)this->fs;
        iVar12 = pbVar3->usable_cluster_count;
        *(undefined8 *)((long)pvVar11 + -8) = 0x10623a;
        fseek(pFVar5,(long)(int)(dir_cluster * (int)(short)uVar2) +
                     (long)iVar12 * (long)(int)cVar1 * 4 + 0x110,0);
        pFVar5 = (FILE *)this->fs;
        *(undefined8 *)((long)pvVar11 + -8) = 1;
        sVar6 = *(size_t *)((long)pvVar11 + -8);
        *(undefined8 *)((long)pvVar11 + -8) = 0x10624c;
        fwrite(pvVar11,(ulong)uVar15,sVar6,pFVar5);
        *(undefined8 *)((long)pvVar11 + -8) = 0x10625f;
        poVar9 = std::operator<<((ostream *)&std::cout,"OK");
        *(undefined8 *)((long)pvVar11 + -8) = 0x106267;
        std::endl<char,std::char_traits<char>>(poVar9);
        puStack_d0 = (undefined1 *)0x106274;
        std::_Vector_base<fat::directory,_std::allocator<fat::directory>_>::~_Vector_base
                  ((_Vector_base<fat::directory,_std::allocator<fat::directory>_> *)
                   &dir_children.super__Vector_base<fat::directory,_std::allocator<fat::directory>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        puStack_d0 = (undefined1 *)0x10627d;
        std::_Vector_base<fat::directory,_std::allocator<fat::directory>_>::~_Vector_base
                  ((_Vector_base<fat::directory,_std::allocator<fat::directory>_> *)
                   &result.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        puStack_d0 = (undefined1 *)0x106289;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_90);
        return;
      }
      puStack_d0 = (undefined1 *)0x1062e5;
      poVar9 = std::operator<<((ostream *)&std::cout,"PATH NOT FOUND");
      puStack_d0 = (undefined1 *)0x1062ed;
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      puStack_d0 = (undefined1 *)0x1062c8;
      poVar9 = std::operator<<((ostream *)&std::cout,"PATH NOT EMPTY");
      puStack_d0 = (undefined1 *)0x1062d0;
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  puStack_d0 = &LAB_001062f5;
  exit(1);
}

Assistant:

void fat::delete_directory(std::string dir_path) {
    std::vector<std::string> result = explode(dir_path, '/');
    if(result.size() == 0){
        std::cout << "CANNOT DELETE ROOT" << std::endl;
        exit(1);
    }
    int32_t directory = get_parent_cluster(result);
    std::vector<fat::directory> dir_children = get_dir_children(directory);
    if (dir_children.size() > 0) {
        std::cout << "PATH NOT EMPTY" << std::endl;
        exit(1);
    }

    if (directory < 0) {
        std::cout << "PATH NOT FOUND" << std::endl;
        exit(1);
    }

    result.pop_back();
    int32_t parent = get_parent_cluster(result);
    std::vector<fat::directory> parent_children = get_dir_children(parent);
    // ---
    // Updating the parent directory content
    // ---
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               parent * fs_br->cluster_size), SEEK_SET);
    int16_t ac_size = 0;
    for (int j = 0; j < parent_children.size(); j++) {
        if (parent_children.at(j).start_cluster != directory) {
            fwrite(&parent_children.at(j), sizeof(fat::directory), 1, fs);
            ac_size += sizeof(fat::directory);
        }
    }
    char buffer[] = {'\0'};
    for (int16_t i = 0; i < (fs_br->cluster_size - ac_size); i++) {
        fwrite(buffer, sizeof(buffer), 1, fs);
    }

    // ---
    // Updating all FAT table copies
    // ---
    int32_t new_fat[fs_br->usable_cluster_count];
    for (int k = 0; k < fs_br->usable_cluster_count; k++) {
        new_fat[k] = fat_table[k];
    }
    new_fat[directory] = FAT_UNUSED;

    fseek(fs, sizeof(boot_record), SEEK_SET);
    for (int i = 0; i < fs_br->fat_copies; i++) {
        fwrite(&new_fat, sizeof(new_fat), 1, fs);
    }

    // ---
    // Erasing directory 'content' in FAT, just to be sure
    // ---
    char cluster_empty[fs_br->cluster_size];
    memset(cluster_empty, '\0', sizeof(cluster_empty));
    fseek(fs, (sizeof(boot_record) + (fs_br->fat_copies * sizeof(*fat_table) * fs_br->usable_cluster_count) +
               directory * fs_br->cluster_size), SEEK_SET);
    fwrite(&cluster_empty, sizeof(cluster_empty), 1, fs);

    std::cout << "OK" << std::endl;
}